

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_clzi_i32_arm(TCGContext_conflict *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,uint32_t arg2)

{
  TCGv_i32 arg2_00;
  TCGv_i32 t;
  uint32_t arg2_local;
  TCGv_i32 arg1_local;
  TCGv_i32 ret_local;
  TCGContext_conflict *tcg_ctx_local;
  
  arg2_00 = tcg_const_i32_arm(tcg_ctx,arg2);
  tcg_gen_clz_i32_arm(tcg_ctx,ret,arg1,arg2_00);
  tcg_temp_free_i32(tcg_ctx,arg2_00);
  return;
}

Assistant:

void tcg_gen_clzi_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, uint32_t arg2)
{
    TCGv_i32 t = tcg_const_i32(tcg_ctx, arg2);
    tcg_gen_clz_i32(tcg_ctx, ret, arg1, t);
    tcg_temp_free_i32(tcg_ctx, t);
}